

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lms.cpp
# Opt level: O1

void __thiscall CGameControllerLMS::DoWincheckRound(CGameControllerLMS *this)

{
  int *piVar1;
  IServer *pIVar2;
  CPlayer *this_00;
  int iVar3;
  CCharacter *pCVar4;
  int iVar5;
  int AlivePlayerCount;
  int i;
  long lVar6;
  CPlayer *pAlivePlayer;
  CPlayer *pCVar7;
  
  iVar3 = (this->super_IGameController).m_GameInfo.m_TimeLimit;
  if ((iVar3 < 1) ||
     (pIVar2 = (this->super_IGameController).m_pServer,
     iVar5 = pIVar2->m_CurrentGameTick - (this->super_IGameController).m_GameStartTick,
     iVar3 = iVar3 * pIVar2->m_TickSpeed, SBORROW4(iVar5,iVar3 * 0x3c) != iVar5 + iVar3 * -0x3c < 0)
     ) {
    lVar6 = 0;
    iVar3 = 0;
    pCVar7 = (CPlayer *)0x0;
    do {
      this_00 = ((this->super_IGameController).m_pGameServer)->m_apPlayers[lVar6];
      if ((this_00 != (CPlayer *)0x0) && (this_00->m_Team != -1)) {
        if (this_00->m_RespawnDisabled == true) {
          pCVar4 = CPlayer::GetCharacter(this_00);
          if (pCVar4 != (CCharacter *)0x0) {
            pCVar4 = CPlayer::GetCharacter
                               (((this->super_IGameController).m_pGameServer)->m_apPlayers[lVar6]);
            if (pCVar4->m_Alive == true) goto LAB_00122b86;
          }
        }
        else {
LAB_00122b86:
          iVar3 = iVar3 + 1;
          pCVar7 = ((this->super_IGameController).m_pGameServer)->m_apPlayers[lVar6];
        }
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 != 0x40);
    if (iVar3 != 0) {
      if (iVar3 != 1) {
        return;
      }
      pCVar7->m_Score = pCVar7->m_Score + 1;
    }
  }
  else {
    lVar6 = 0;
    do {
      pCVar7 = ((this->super_IGameController).m_pGameServer)->m_apPlayers[lVar6];
      if ((pCVar7 != (CPlayer *)0x0) && (pCVar7->m_Team != -1)) {
        if (pCVar7->m_RespawnDisabled == true) {
          pCVar4 = CPlayer::GetCharacter(pCVar7);
          if (pCVar4 != (CCharacter *)0x0) {
            pCVar4 = CPlayer::GetCharacter
                               (((this->super_IGameController).m_pGameServer)->m_apPlayers[lVar6]);
            if (pCVar4->m_Alive == true) goto LAB_00122bfa;
          }
        }
        else {
LAB_00122bfa:
          piVar1 = &((this->super_IGameController).m_pGameServer)->m_apPlayers[lVar6]->m_Score;
          *piVar1 = *piVar1 + 1;
        }
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 != 0x40);
  }
  IGameController::SetGameState(&this->super_IGameController,IGS_END_ROUND,5);
  return;
}

Assistant:

void CGameControllerLMS::DoWincheckRound()
{
	// check for time based win
	if(m_GameInfo.m_TimeLimit > 0 && (Server()->Tick()-m_GameStartTick) >= m_GameInfo.m_TimeLimit*Server()->TickSpeed()*60)
	{
		for(int i = 0; i < MAX_CLIENTS; ++i)
		{
			if(GameServer()->m_apPlayers[i] && GameServer()->m_apPlayers[i]->GetTeam() != TEAM_SPECTATORS &&
				(!GameServer()->m_apPlayers[i]->m_RespawnDisabled ||
				(GameServer()->m_apPlayers[i]->GetCharacter() && GameServer()->m_apPlayers[i]->GetCharacter()->IsAlive())))
				GameServer()->m_apPlayers[i]->m_Score++;
		}

		EndRound();
	}
	else
	{
		// check for survival win
		CPlayer *pAlivePlayer = 0;
		int AlivePlayerCount = 0;
		for(int i = 0; i < MAX_CLIENTS; ++i)
		{
			if(GameServer()->m_apPlayers[i] && GameServer()->m_apPlayers[i]->GetTeam() != TEAM_SPECTATORS &&
				(!GameServer()->m_apPlayers[i]->m_RespawnDisabled ||
				(GameServer()->m_apPlayers[i]->GetCharacter() && GameServer()->m_apPlayers[i]->GetCharacter()->IsAlive())))
			{
				++AlivePlayerCount;
				pAlivePlayer = GameServer()->m_apPlayers[i];
			}
		}

		if(AlivePlayerCount == 0)		// no winner
			EndRound();
		else if(AlivePlayerCount == 1)	// 1 winner
		{
			pAlivePlayer->m_Score++;
			EndRound();
		}
	}
}